

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O2

string * __thiscall
license::get_file_contents_abi_cxx11_
          (string *__return_storage_ptr__,license *this,char *filename,size_t max_size)

{
  runtime_error *this_00;
  int *piVar1;
  char *pcVar2;
  ifstream in;
  byte abStack_200 [488];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&in,(char *)this,_S_bin);
  if ((abStack_200[*(long *)(_in + -0x18)] & 5) == 0) {
    std::istream::seekg((long)&in,_S_beg);
    std::istream::tellg();
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    std::istream::seekg((long)&in,_S_beg);
    std::istream::read((char *)&in,(long)(__return_storage_ptr__->_M_dataplus)._M_p);
    std::ifstream::close();
    std::ifstream::~ifstream(&in);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  piVar1 = __errno_location();
  pcVar2 = strerror(*piVar1);
  std::runtime_error::runtime_error(this_00,pcVar2);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

string get_file_contents(const char *filename, size_t max_size) {
	string contents;
	ifstream in(filename, std::ios::binary);
	if (in) {
		size_t index = (size_t)in.seekg(0, ios::end).tellg();
		size_t limited_size = min(index, max_size);
		contents.resize(limited_size);
		in.seekg(0, ios::beg);
		in.read(&contents[0], limited_size);
		in.close();
	} else {
		throw runtime_error(std::strerror(errno));
	}
	return contents;
}